

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.h
# Opt level: O0

void CHECK_DOUBLE(char *var,uint index,double expected,bool *lastFailed)

{
  void *pvVar1;
  double *data;
  void *variablePtr;
  bool *lastFailed_local;
  double expected_local;
  uint index_local;
  char *var_local;
  
  pvVar1 = Tests::FindVar(var);
  if (pvVar1 == (void *)0x0) {
    if (Tests::lastMessage != 0) {
      printf("%s\r\n",Tests::lastMessage);
    }
    printf(" Failed to find variable %s\r\n",var);
    *lastFailed = true;
  }
  else if (1e-06 < ABS(*(double *)((long)pvVar1 + (ulong)index * 8) - expected)) {
    if (Tests::lastMessage != 0) {
      printf("%s\r\n",Tests::lastMessage);
    }
    printf(" Failed %s[%d] == %f (got %f)\r\n",expected,
           (int)*(undefined8 *)((long)pvVar1 + (ulong)index * 8),var,(ulong)index);
    *lastFailed = true;
  }
  return;
}

Assistant:

inline void CHECK_DOUBLE(const char *var, unsigned index, double expected, bool &lastFailed)
{
	if(void *variablePtr = Tests::FindVar(var))
	{
		double *data = (double*)variablePtr;

		if(fabs(data[index] - expected) > 1e-6)
		{
			if(Tests::lastMessage)
				printf("%s\r\n", Tests::lastMessage);

			printf(" Failed %s[%d] == %f (got %f)\r\n", var, index, (double)expected, data[index]);
			lastFailed = true;
		}
	}
	else
	{
		if(Tests::lastMessage)
			printf("%s\r\n", Tests::lastMessage);

		printf(" Failed to find variable %s\r\n", var);
		lastFailed = true;
	}
}